

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O3

bool __thiscall pbrt::DisplayItem::Display(DisplayItem *this,IPCChannel *ipcChannel)

{
  int iVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  pointer pIVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  pointer pIVar13;
  int iVar14;
  int tileIndex;
  int iVar15;
  vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> displayValues;
  vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_> local_70;
  _Any_data *local_58;
  Bounds2<int> local_50;
  span<pstd::span<float>_> local_40;
  
  if (this->openedImage == false) {
    bVar4 = SendOpenImage(this,ipcChannel);
    if (!bVar4) {
      return false;
    }
    this->openedImage = true;
  }
  std::vector<pstd::span<float>,_std::allocator<pstd::span<float>_>_>::vector
            (&local_70,
             (long)(this->channelBuffers).
                   super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->channelBuffers).
                   super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_50);
  pIVar13 = (this->channelBuffers).
            super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pIVar7 = (this->channelBuffers).
           super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar7 != pIVar13) {
    lVar6 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 + 1;
      *(long *)((long)&(local_70.
                        super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->ptr + lVar6) =
           (long)(&pIVar13->channelValuesOffset)[lVar6] +
           *(long *)((long)&(pIVar13->buffer).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar6 * 4);
      *(undefined8 *)
       ((long)&(local_70.super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->n + lVar6) = 0x4000;
      lVar6 = lVar6 + 0x10;
      pIVar7 = (this->channelBuffers).
               super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pIVar13 = (this->channelBuffers).
                super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)pIVar7 - (long)pIVar13 >> 6));
  }
  iVar8 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  bVar4 = true;
  if (0 < iVar8) {
    local_58 = (_Any_data *)&this->getTileValues;
    tileIndex = 0;
    iVar5 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
    iVar15 = 0;
    do {
      iVar14 = iVar15 + 0x80;
      if (0 < iVar5) {
        iVar8 = 0;
        do {
          iVar11 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          iVar1 = iVar8 + 0x80;
          if (iVar14 <= iVar11) {
            iVar11 = iVar14;
          }
          if (iVar1 <= iVar5) {
            iVar5 = iVar1;
          }
          if (pIVar7 != pIVar13) {
            lVar6 = 0;
            uVar9 = 0;
            do {
              lVar2 = *(long *)((long)&(pIVar13->buffer).
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar6);
              lVar10 = (long)*(int *)((long)&pIVar13->tileBoundsOffset + lVar6);
              uVar9 = uVar9 + 1;
              *(int *)(lVar2 + lVar10) = iVar8;
              *(int *)(lVar2 + 4 + lVar10) = iVar15;
              *(int *)(lVar2 + 8 + lVar10) = iVar5 - iVar8;
              *(int *)(lVar2 + 0xc + lVar10) = iVar11 - iVar15;
              *(int *)((long)&pIVar13->setCount + lVar6) = (iVar11 - iVar15) * (iVar5 - iVar8);
              lVar6 = lVar6 + 0x40;
              pIVar13 = (this->channelBuffers).
                        super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar9 < (ulong)((long)(this->channelBuffers).
                                           super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pIVar13 >> 6));
          }
          iVar3 = iVar8;
          if (iVar5 < iVar8) {
            iVar3 = iVar5;
          }
          iVar12 = iVar15;
          if (iVar11 < iVar15) {
            iVar12 = iVar11;
          }
          local_50.pMin.super_Tuple2<pbrt::Point2,_int>.y = iVar12;
          local_50.pMin.super_Tuple2<pbrt::Point2,_int>.x = iVar3;
          if (iVar5 < iVar8) {
            iVar5 = iVar8;
          }
          if (iVar11 < iVar15) {
            iVar11 = iVar15;
          }
          local_50.pMax.super_Tuple2<pbrt::Point2,_int>.y = iVar11;
          local_50.pMax.super_Tuple2<pbrt::Point2,_int>.x = iVar5;
          local_40.ptr = local_70.
                         super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          local_40.n = (long)local_70.
                             super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_70.
                             super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4;
          if ((this->getTileValues).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->getTileValues)._M_invoker)(local_58,&local_50,&local_40);
          pIVar13 = (this->channelBuffers).
                    super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar7 = (this->channelBuffers).
                   super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pIVar7 != pIVar13) {
            lVar6 = 0;
            uVar9 = 0;
            do {
              bVar4 = ImageChannelBuffer::SendIfChanged
                                ((ImageChannelBuffer *)
                                 ((long)&(pIVar13->buffer).
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar6),
                                 ipcChannel,tileIndex);
              if (!bVar4) {
                bVar4 = false;
                this->openedImage = false;
                goto LAB_002cb9d1;
              }
              pIVar7 = (this->channelBuffers).
                       super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              pIVar13 = (this->channelBuffers).
                        super__Vector_base<pbrt::DisplayItem::ImageChannelBuffer,_std::allocator<pbrt::DisplayItem::ImageChannelBuffer>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar9 = uVar9 + 1;
              lVar6 = lVar6 + 0x40;
            } while (uVar9 < (ulong)((long)pIVar7 - (long)pIVar13 >> 6));
          }
          iVar5 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
          tileIndex = tileIndex + 1;
          iVar8 = iVar1;
        } while (iVar1 < iVar5);
        iVar8 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
      }
      iVar15 = iVar14;
    } while (iVar14 < iVar8);
    bVar4 = true;
  }
LAB_002cb9d1:
  if (local_70.super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.
                    super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<pstd::span<float>,_std::allocator<pstd::span<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool DisplayItem::Display(IPCChannel &ipcChannel) {
    if (!openedImage) {
        if (!SendOpenImage(ipcChannel))
            // maybe next time
            return false;
        openedImage = true;
    }

    std::vector<pstd::span<Float>> displayValues(channelBuffers.size());
    for (int c = 0; c < channelBuffers.size(); ++c) {
        Float *ptr = (Float *)(channelBuffers[c].buffer.data() +
                               channelBuffers[c].channelValuesOffset);
        displayValues[c] = pstd::MakeSpan(ptr, tileSize * tileSize);
    }

    int tileIndex = 0;
    for (int y = 0; y < resolution.y; y += tileSize)
        for (int x = 0; x < resolution.x; x += tileSize, ++tileIndex) {
            int height = std::min(y + tileSize, resolution.y) - y;
            int width = std::min(x + tileSize, resolution.x) - x;

            for (int c = 0; c < channelBuffers.size(); ++c)
                channelBuffers[c].SetTileBounds(x, y, width, height);

            Bounds2i b(Point2i(x, y), Point2i(x + width, y + height));
            getTileValues(b, pstd::MakeSpan(displayValues));

            // Send the RGB buffers only if they're different than
            // the last version sent.
            for (int c = 0; c < channelBuffers.size(); ++c)
                if (!channelBuffers[c].SendIfChanged(ipcChannel, tileIndex)) {
                    // Welp. Stop for now...
                    openedImage = false;
                    return false;
                }
        }

    return true;
}